

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O3

void __thiscall
cnn::Model::load<boost::archive::text_iarchive>(Model *this,text_iarchive *ar,uint param_2)

{
  basic_iserializer *pbVar1;
  undefined8 *puVar2;
  iterator iVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  undefined8 *puVar7;
  ulong uVar8;
  undefined8 *puVar9;
  void *x;
  undefined8 *puVar10;
  int nlp;
  int np;
  ParametersBase *local_40;
  int local_38;
  int local_34;
  
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_34);
  boost::archive::basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_>::
  load<int>((basic_text_iprimitive<std::basic_istream<char,_std::char_traits<char>_>_> *)
            &ar->field_0x28,&local_38);
  lVar5 = *(long *)(this + 0x18);
  if (local_34 != (int)((ulong)(*(long *)(this + 0x20) - lVar5) >> 3)) {
    __assert_fail("np == (int)params.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                  ,0x89,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  puVar7 = *(undefined8 **)(this + 0x38);
  puVar9 = *(undefined8 **)(this + 0x30);
  if (local_38 != (int)((ulong)((long)puVar7 - (long)puVar9) >> 3)) {
    __assert_fail("nlp == (int)lookup_params.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/cnn/model.h"
                  ,0x8a,
                  "void cnn::Model::load(Archive &, const unsigned int) [Archive = boost::archive::text_iarchive]"
                 );
  }
  if (*(long *)(this + 0x20) != lVar5) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      pbVar1 = *(basic_iserializer **)(lVar5 + uVar6 * 8);
      boost::serialization::
      singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::Parameters>_>
      ::get_instance();
      boost::archive::detail::basic_iarchive::load_object(ar,pbVar1);
      lVar5 = *(long *)(this + 0x18);
      bVar4 = uVar8 < (ulong)(*(long *)(this + 0x20) - lVar5 >> 3);
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
    puVar9 = *(undefined8 **)(this + 0x30);
    puVar7 = *(undefined8 **)(this + 0x38);
  }
  puVar10 = puVar9;
  if (puVar7 != puVar9) {
    uVar6 = 0;
    uVar8 = 1;
    do {
      pbVar1 = (basic_iserializer *)puVar10[uVar6];
      boost::serialization::
      singleton<boost::archive::detail::iserializer<boost::archive::text_iarchive,_cnn::LookupParameters>_>
      ::get_instance();
      boost::archive::detail::basic_iarchive::load_object(ar,pbVar1);
      puVar9 = *(undefined8 **)(this + 0x38);
      puVar10 = *(undefined8 **)(this + 0x30);
      bVar4 = uVar8 < (ulong)((long)puVar9 - (long)puVar10 >> 3);
      uVar6 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  if (*(long *)(this + 8) != *(long *)this) {
    *(long *)(this + 8) = *(long *)this;
  }
  puVar7 = *(undefined8 **)(this + 0x18);
  puVar2 = *(undefined8 **)(this + 0x20);
  if (puVar7 != puVar2) {
    do {
      local_40 = (ParametersBase *)*puVar7;
      iVar3._M_current = *(ParametersBase ***)(this + 8);
      if (iVar3._M_current == *(ParametersBase ***)(this + 0x10)) {
        std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
        _M_realloc_insert<cnn::ParametersBase*>
                  ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,iVar3,
                   &local_40);
      }
      else {
        *iVar3._M_current = local_40;
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar2);
    puVar10 = *(undefined8 **)(this + 0x30);
    puVar9 = *(undefined8 **)(this + 0x38);
  }
  if (puVar10 != puVar9) {
    do {
      local_40 = (ParametersBase *)*puVar10;
      iVar3._M_current = *(ParametersBase ***)(this + 8);
      if (iVar3._M_current == *(ParametersBase ***)(this + 0x10)) {
        std::vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>>::
        _M_realloc_insert<cnn::ParametersBase*>
                  ((vector<cnn::ParametersBase*,std::allocator<cnn::ParametersBase*>> *)this,iVar3,
                   &local_40);
      }
      else {
        *iVar3._M_current = local_40;
        *(long *)(this + 8) = *(long *)(this + 8) + 8;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar9);
  }
  return;
}

Assistant:

void load(Archive& ar, const unsigned int) {
    int np, nlp;
    ar & np;
    ar & nlp;
    assert(np == (int)params.size());
    assert(nlp == (int)lookup_params.size());
    for (unsigned i = 0; i < params.size(); ++i)
      ar & *params[i];
    for (unsigned i = 0; i < lookup_params.size(); ++i)
      ar & *lookup_params[i];
    all_params.clear();
    for (auto p : params) all_params.push_back(p);
    for (auto p : lookup_params) all_params.push_back(p);
  }